

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# savefile.c
# Opt level: O3

_Bool savefile_load(char *path,_Bool cheat_death)

{
  blockinfo *pbVar1;
  player *ppVar2;
  uint32_t uVar3;
  _Bool _Var4;
  errr eVar5;
  int iVar6;
  ang_file *f;
  char *pcVar7;
  blockinfo *__s2;
  blockheader bStack_48;
  
  safe_setuid_grab();
  f = file_open(path,MODE_READ,FTYPE_TEXT);
  safe_setuid_drop();
  if (f == (ang_file *)0x0) {
    event_signal_message(EVENT_INITSTATUS,L'\x01',"Couldn\'t open savefile.");
    _Var4 = false;
  }
  else {
    _Var4 = check_header(f);
    if (_Var4) {
      do {
        eVar5 = next_blockheader(f,&bStack_48);
        uVar3 = bStack_48.version;
        if (eVar5 != 0) {
          if (eVar5 != -1) {
            _Var4 = true;
            goto LAB_001cd61b;
          }
          pcVar7 = "Savefile is corrupted -- block header mangled.";
          goto LAB_001cd60a;
        }
        __s2 = loaders;
        while ((iVar6 = strcmp(bStack_48.name,__s2->name), iVar6 != 0 || (uVar3 != 1))) {
          pbVar1 = __s2 + 1;
          __s2 = __s2 + 1;
          if (pbVar1->name[0] == '\0') goto LAB_001cd5ed;
        }
        if (__s2->loader == (loader_t)0x0) {
LAB_001cd5ed:
          event_signal_message(EVENT_INITSTATUS,L'\x01',"Savefile block can\'t be read.");
          pcVar7 = "Maybe try and load the savefile in an earlier version of Angband.";
          goto LAB_001cd60a;
        }
        _Var4 = load_block(f,&bStack_48,__s2->loader);
      } while (_Var4);
      _Var4 = false;
      pcVar7 = format("Savefile corrupted - Couldn\'t load block %s",&bStack_48);
      event_signal_message(EVENT_INITSTATUS,L'\x01',pcVar7);
    }
    else {
      pcVar7 = "Savefile is corrupted -- incorrect file header.";
LAB_001cd60a:
      event_signal_message(EVENT_INITSTATUS,L'\x01',pcVar7);
      _Var4 = false;
    }
LAB_001cd61b:
    file_close(f);
    ppVar2 = player;
    if ((cheat_death & player->is_dead) == 1) {
      player->is_dead = false;
      ppVar2->chp = ppVar2->mhp;
      *(byte *)&ppVar2->noscore = (byte)ppVar2->noscore | 2;
    }
    character_generated = true;
    ppVar2->upkeep->playing = true;
  }
  return _Var4;
}

Assistant:

bool savefile_load(const char *path, bool cheat_death)
{
	bool ok;
	ang_file *f;

	safe_setuid_grab();
	f = file_open(path, MODE_READ, FTYPE_TEXT);
	safe_setuid_drop();
	if (!f) {
		note("Couldn't open savefile.");
		return false;
	}

	ok = try_load(f, loaders);
	file_close(f);

	if (player->is_dead && cheat_death) {
			player->is_dead = false;
			player->chp = player->mhp;
			player->noscore |= NOSCORE_WIZARD;
	}

	/* Character is now "complete" */
	character_generated = true;
	player->upkeep->playing = true;

	return ok;
}